

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O3

void __thiscall
booster::callback<void_(const_std::error_code_&)>::callback<sock1>
          (callback<void_(const_std::error_code_&)> *this,sock1 func)

{
  callable<void_(const_std::error_code_&)> *pcVar1;
  
  pcVar1 = (callable<void_(const_std::error_code_&)> *)operator_new(0x28);
  (pcVar1->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__refcounted_0010aae8;
  booster::atomic_counter::atomic_counter(&(pcVar1->super_refcounted).refs_,0);
  (pcVar1->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__refcounted_0010aa80;
  pcVar1[1].super_refcounted._vptr_refcounted = (_func_int **)func._0_8_;
  *(io_service **)&pcVar1[1].super_refcounted.refs_ = func.srv;
  pcVar1[2].super_refcounted._vptr_refcounted = (_func_int **)func._16_8_;
  (this->call_ptr).p_ = pcVar1;
  booster::atomic_counter::inc();
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}